

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 (*pauVar2) [64];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [24];
  undefined1 (*pauVar5) [16];
  float fVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [24];
  long lVar18;
  long lVar19;
  int iVar20;
  undefined8 *puVar21;
  int iVar22;
  int iVar23;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  __m128 _p128_3;
  __m256 _p256_3;
  __m512 _p512_3;
  __m512 _slope512_3;
  __m256 _slope256_3;
  __m128 _slope128_3;
  float slope_3;
  int i_9;
  float *ptr_3;
  int q;
  int size_2;
  __m128 _p128_2;
  __m256 _p256_2;
  __m512 _p512_2;
  __m512 _slope512_2;
  __m256 _slope256_2;
  __m128 _slope128_2;
  float slope_2;
  int j;
  float *ptr_2;
  int i_8;
  int size_1;
  int i_7;
  __m128 _slope128_1;
  __m128 _p128_1;
  int i_6;
  int ii_5;
  __m256 _slope256_1;
  __m256 _p256_1;
  int i_5;
  int ii_4;
  __m512 _slope512_1;
  __m512 _p512_1;
  int i_4;
  int ii_3;
  int remain_size_start_1;
  int nn_size_1;
  float slope_1;
  float *ptr_1;
  int i_3;
  __m128 _slope128;
  __m128 _p128;
  int i_2;
  int ii_2;
  __m256 _slope256;
  __m256 _p256;
  int i_1;
  int ii_1;
  __m512 _slope512;
  __m512 _p512;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  float *slope;
  float *ptr;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  __m512 neg_9;
  __m512 pos_9;
  __m512 neg_6;
  __m512 pos_6;
  __m512 neg_3;
  __m512 pos_3;
  __m512 neg;
  __m512 pos;
  __m256 neg_10;
  __m256 pos_10;
  __m256 neg_7;
  __m256 pos_7;
  __m256 neg_4;
  __m256 pos_4;
  __m256 neg_1;
  __m256 pos_1;
  __m128 neg_11;
  __m128 pos_11;
  __m128 neg_8;
  __m128 pos_8;
  __m128 neg_5;
  __m128 pos_5;
  __m128 neg_2;
  __m128 pos_2;
  Mat *m;
  undefined1 local_26c0 [64];
  undefined1 local_2660 [32];
  undefined8 local_2640;
  undefined8 uStack_2638;
  float local_262c;
  undefined1 local_2600 [64];
  undefined1 local_25c0 [32];
  undefined8 local_2590;
  undefined8 uStack_2588;
  float local_2580;
  int local_2458;
  undefined1 (*local_2400) [64];
  int local_23f8;
  int local_22ec;
  undefined1 (*local_22e8) [64];
  int local_22dc;
  int local_22d4;
  int local_22a4;
  int local_2244;
  int local_21b0;
  int local_2194;
  int local_2164;
  int local_2104;
  int local_2054;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  
  iVar20 = (int)in_RSI[5];
  iVar7 = *(int *)((long)in_RSI + 0x2c);
  lVar18 = in_RSI[6];
  lVar19 = in_RSI[7];
  iVar8 = (int)in_RSI[3];
  if (iVar20 == 1) {
    iVar22 = iVar7 * iVar8;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
      lVar9 = *in_RSI;
      fVar6 = **(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      for (local_21b0 = 0; local_21b0 < iVar22 / 0x10; local_21b0 = local_21b0 + 1) {
        pauVar2 = (undefined1 (*) [64])(lVar9 + (long)(local_21b0 * 0x10) * 4);
        auVar24 = vbroadcastss_avx512f(ZEXT416((uint)fVar6));
        puVar21 = (undefined8 *)(lVar9 + (long)(local_21b0 * 0x10) * 4);
        auVar25 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*pauVar2);
        auVar26 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*pauVar2);
        auVar24 = vmulps_avx512f(auVar24,auVar26);
        auVar24 = vaddps_avx512f(auVar25,auVar24);
        local_1e80 = auVar24._0_8_;
        uStack_1e78 = auVar24._8_8_;
        uStack_1e70 = auVar24._16_8_;
        uStack_1e68 = auVar24._24_8_;
        uStack_1e60 = auVar24._32_8_;
        uStack_1e58 = auVar24._40_8_;
        uStack_1e50 = auVar24._48_8_;
        uStack_1e48 = auVar24._56_8_;
        *puVar21 = local_1e80;
        puVar21[1] = uStack_1e78;
        puVar21[2] = uStack_1e70;
        puVar21[3] = uStack_1e68;
        puVar21[4] = uStack_1e60;
        puVar21[5] = uStack_1e58;
        puVar21[6] = uStack_1e50;
        puVar21[7] = uStack_1e48;
      }
      local_22d4 = (iVar22 / 0x10) * 0x10;
      iVar23 = (iVar22 % 0x10) / 8;
      for (local_2244 = 0; local_2244 < iVar23; local_2244 = local_2244 + 1) {
        iVar1 = local_22d4 + local_2244 * 8;
        pauVar3 = (undefined1 (*) [32])(lVar9 + (long)iVar1 * 4);
        auVar11 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),0x10);
        auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar6),0x20);
        auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar6),0x30);
        auVar13 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),0x10);
        auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar6),0x20);
        auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar6),0x30);
        puVar21 = (undefined8 *)(lVar9 + (long)iVar1 * 4);
        auVar12 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*pauVar3);
        auVar14 = vminps_avx(ZEXT1632(ZEXT816(0)),*pauVar3);
        local_440 = auVar11._0_4_;
        fStack_43c = auVar11._4_4_;
        fStack_438 = auVar11._8_4_;
        fStack_434 = auVar11._12_4_;
        fStack_430 = auVar13._0_4_;
        fStack_42c = auVar13._4_4_;
        fStack_428 = auVar13._8_4_;
        fStack_424 = auVar13._12_4_;
        local_460 = auVar14._0_4_;
        fStack_45c = auVar14._4_4_;
        fStack_458 = auVar14._8_4_;
        fStack_454 = auVar14._12_4_;
        fStack_450 = auVar14._16_4_;
        fStack_44c = auVar14._20_4_;
        fStack_448 = auVar14._24_4_;
        local_540 = auVar12._0_4_;
        fStack_53c = auVar12._4_4_;
        fStack_538 = auVar12._8_4_;
        fStack_534 = auVar12._12_4_;
        fStack_530 = auVar12._16_4_;
        fStack_52c = auVar12._20_4_;
        fStack_528 = auVar12._24_4_;
        fStack_524 = auVar12._28_4_;
        *puVar21 = CONCAT44(fStack_53c + fStack_43c * fStack_45c,local_540 + local_440 * local_460);
        puVar21[1] = CONCAT44(fStack_534 + fStack_434 * fStack_454,
                              fStack_538 + fStack_438 * fStack_458);
        puVar21[2] = CONCAT44(fStack_52c + fStack_42c * fStack_44c,
                              fStack_530 + fStack_430 * fStack_450);
        puVar21[3] = CONCAT44(fStack_524 + fStack_424,fStack_528 + fStack_428 * fStack_448);
      }
      local_22d4 = iVar23 * 8 + local_22d4;
      iVar23 = (iVar22 - local_22d4) / 4;
      for (local_22a4 = 0; local_22a4 < iVar23; local_22a4 = local_22a4 + 1) {
        iVar1 = local_22d4 + local_22a4 * 4;
        pauVar5 = (undefined1 (*) [16])(lVar9 + (long)iVar1 * 4);
        puVar21 = (undefined8 *)(lVar9 + (long)iVar1 * 4);
        auVar11 = vmaxps_avx(ZEXT816(0),*pauVar5);
        auVar13 = vminps_avx(ZEXT816(0),*pauVar5);
        local_180 = auVar13._0_4_;
        fStack_17c = auVar13._4_4_;
        fStack_178 = auVar13._8_4_;
        fStack_174 = auVar13._12_4_;
        local_1f0 = auVar11._0_4_;
        fStack_1ec = auVar11._4_4_;
        fStack_1e8 = auVar11._8_4_;
        fStack_1e4 = auVar11._12_4_;
        *puVar21 = CONCAT44(fStack_1ec + fVar6 * fStack_17c,local_1f0 + fVar6 * local_180);
        puVar21[1] = CONCAT44(fStack_1e4 + fVar6 * fStack_174,fStack_1e8 + fVar6 * fStack_178);
      }
      for (local_22d4 = iVar23 * 4 + local_22d4; local_22d4 < iVar22; local_22d4 = local_22d4 + 1) {
        if (*(float *)(lVar9 + (long)local_22d4 * 4) < 0.0) {
          *(float *)(lVar9 + (long)local_22d4 * 4) =
               fVar6 * *(float *)(lVar9 + (long)local_22d4 * 4);
        }
      }
    }
    else {
      lVar9 = *in_RSI;
      lVar10 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      for (local_2054 = 0; local_2054 < iVar22 / 0x10; local_2054 = local_2054 + 1) {
        iVar23 = local_2054 * 0x10;
        pauVar2 = (undefined1 (*) [64])(lVar9 + (long)iVar23 * 4);
        puVar21 = (undefined8 *)(lVar9 + (long)iVar23 * 4);
        auVar24 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*pauVar2);
        auVar25 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*pauVar2);
        auVar25 = vmulps_avx512f(*(undefined1 (*) [64])(lVar10 + (long)iVar23 * 4),auVar25);
        auVar24 = vaddps_avx512f(auVar24,auVar25);
        local_1e00 = auVar24._0_8_;
        uStack_1df8 = auVar24._8_8_;
        uStack_1df0 = auVar24._16_8_;
        uStack_1de8 = auVar24._24_8_;
        uStack_1de0 = auVar24._32_8_;
        uStack_1dd8 = auVar24._40_8_;
        uStack_1dd0 = auVar24._48_8_;
        uStack_1dc8 = auVar24._56_8_;
        *puVar21 = local_1e00;
        puVar21[1] = uStack_1df8;
        puVar21[2] = uStack_1df0;
        puVar21[3] = uStack_1de8;
        puVar21[4] = uStack_1de0;
        puVar21[5] = uStack_1dd8;
        puVar21[6] = uStack_1dd0;
        puVar21[7] = uStack_1dc8;
      }
      local_2194 = (iVar22 / 0x10) * 0x10;
      iVar23 = (iVar22 % 0x10) / 8;
      for (local_2104 = 0; local_2104 < iVar23; local_2104 = local_2104 + 1) {
        iVar1 = local_2194 + local_2104 * 8;
        pauVar3 = (undefined1 (*) [32])(lVar9 + (long)iVar1 * 4);
        pauVar4 = (undefined1 (*) [24])(lVar10 + (long)iVar1 * 4);
        auVar17 = *pauVar4;
        uVar15 = *(undefined8 *)pauVar4[1];
        puVar21 = (undefined8 *)(lVar9 + (long)iVar1 * 4);
        auVar12 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*pauVar3);
        auVar14 = vminps_avx(ZEXT1632(ZEXT816(0)),*pauVar3);
        local_480 = auVar17._0_4_;
        fStack_47c = auVar17._4_4_;
        fStack_478 = auVar17._8_4_;
        fStack_474 = auVar17._12_4_;
        fStack_470 = auVar17._16_4_;
        fStack_46c = auVar17._20_4_;
        fStack_468 = (float)uVar15;
        fStack_464 = (float)((ulong)uVar15 >> 0x20);
        local_4a0 = auVar14._0_4_;
        fStack_49c = auVar14._4_4_;
        fStack_498 = auVar14._8_4_;
        fStack_494 = auVar14._12_4_;
        fStack_490 = auVar14._16_4_;
        fStack_48c = auVar14._20_4_;
        fStack_488 = auVar14._24_4_;
        local_580 = auVar12._0_4_;
        fStack_57c = auVar12._4_4_;
        fStack_578 = auVar12._8_4_;
        fStack_574 = auVar12._12_4_;
        fStack_570 = auVar12._16_4_;
        fStack_56c = auVar12._20_4_;
        fStack_568 = auVar12._24_4_;
        fStack_564 = auVar12._28_4_;
        *puVar21 = CONCAT44(fStack_57c + fStack_47c * fStack_49c,local_580 + local_480 * local_4a0);
        puVar21[1] = CONCAT44(fStack_574 + fStack_474 * fStack_494,
                              fStack_578 + fStack_478 * fStack_498);
        puVar21[2] = CONCAT44(fStack_56c + fStack_46c * fStack_48c,
                              fStack_570 + fStack_470 * fStack_490);
        puVar21[3] = CONCAT44(fStack_564 + fStack_464,fStack_568 + fStack_468 * fStack_488);
      }
      local_2194 = iVar23 * 8 + local_2194;
      iVar23 = (iVar22 - local_2194) / 4;
      for (local_2164 = 0; local_2164 < iVar23; local_2164 = local_2164 + 1) {
        iVar1 = local_2194 + local_2164 * 4;
        pauVar5 = (undefined1 (*) [16])(lVar9 + (long)iVar1 * 4);
        puVar21 = (undefined8 *)(lVar10 + (long)iVar1 * 4);
        uVar15 = *puVar21;
        uVar16 = puVar21[1];
        puVar21 = (undefined8 *)(lVar9 + (long)iVar1 * 4);
        auVar11 = vmaxps_avx(ZEXT816(0),*pauVar5);
        auVar13 = vminps_avx(ZEXT816(0),*pauVar5);
        local_190 = (float)uVar15;
        fStack_18c = (float)((ulong)uVar15 >> 0x20);
        fStack_188 = (float)uVar16;
        fStack_184 = (float)((ulong)uVar16 >> 0x20);
        local_1a0 = auVar13._0_4_;
        fStack_19c = auVar13._4_4_;
        fStack_198 = auVar13._8_4_;
        fStack_194 = auVar13._12_4_;
        local_210 = auVar11._0_4_;
        fStack_20c = auVar11._4_4_;
        fStack_208 = auVar11._8_4_;
        fStack_204 = auVar11._12_4_;
        *puVar21 = CONCAT44(fStack_20c + fStack_18c * fStack_19c,local_210 + local_190 * local_1a0);
        puVar21[1] = CONCAT44(fStack_204 + fStack_184 * fStack_194,
                              fStack_208 + fStack_188 * fStack_198);
      }
      for (local_2194 = iVar23 * 4 + local_2194; local_2194 < iVar22; local_2194 = local_2194 + 1) {
        if (*(float *)(lVar9 + (long)local_2194 * 4) < 0.0) {
          *(float *)(lVar9 + (long)local_2194 * 4) =
               *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                         (long)local_2194 * 4) * *(float *)(lVar9 + (long)local_2194 * 4);
        }
      }
    }
  }
  if (iVar20 == 2) {
    iVar22 = iVar7 * iVar8;
    for (local_22dc = 0; local_22dc < (int)lVar18; local_22dc = local_22dc + 1) {
      local_22e8 = (undefined1 (*) [64])
                   (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_22dc * in_RSI[2]);
      local_22ec = 0;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
        local_2580 = **(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      }
      else {
        local_2580 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                               (long)local_22dc * 4);
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar8 != 4)) {
        local_2590 = CONCAT44(local_2580,local_2580);
        uStack_2588 = CONCAT44(local_2580,local_2580);
      }
      else {
        puVar21 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  (long)(local_22dc << 2) * 4);
        local_2590 = *puVar21;
        uStack_2588 = puVar21[1];
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar8 != 8)) {
        local_25c0._8_8_ = uStack_2588;
        local_25c0._0_8_ = local_2590;
        local_25c0._24_8_ = uStack_2588;
        local_25c0._16_8_ = local_2590;
      }
      else {
        local_25c0 = *(undefined1 (*) [32])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      (long)(local_22dc << 3) * 4);
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar8 != 0x10)) {
        local_2600 = vinsertf64x4_avx512f(ZEXT3264(local_25c0),local_25c0,1);
      }
      else {
        local_2600 = *(undefined1 (*) [64])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      (long)(local_22dc << 4) * 4);
      }
      for (; local_22ec + 0xf < iVar22; local_22ec = local_22ec + 0x10) {
        auVar24 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*local_22e8);
        auVar25 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*local_22e8);
        auVar25 = vmulps_avx512f(local_2600,auVar25);
        auVar24 = vaddps_avx512f(auVar24,auVar25);
        local_1f00 = auVar24._0_8_;
        uStack_1ef8 = auVar24._8_8_;
        uStack_1ef0 = auVar24._16_8_;
        uStack_1ee8 = auVar24._24_8_;
        uStack_1ee0 = auVar24._32_8_;
        uStack_1ed8 = auVar24._40_8_;
        uStack_1ed0 = auVar24._48_8_;
        uStack_1ec8 = auVar24._56_8_;
        *(undefined8 *)*local_22e8 = local_1f00;
        *(undefined8 *)(*local_22e8 + 8) = uStack_1ef8;
        *(undefined8 *)(*local_22e8 + 0x10) = uStack_1ef0;
        *(undefined8 *)(*local_22e8 + 0x18) = uStack_1ee8;
        *(undefined8 *)(*local_22e8 + 0x20) = uStack_1ee0;
        *(undefined8 *)(*local_22e8 + 0x28) = uStack_1ed8;
        *(undefined8 *)(*local_22e8 + 0x30) = uStack_1ed0;
        *(undefined8 *)(*local_22e8 + 0x38) = uStack_1ec8;
        local_22e8 = local_22e8 + 1;
      }
      for (; local_22ec + 7 < iVar22; local_22ec = local_22ec + 8) {
        auVar12 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_22e8);
        auVar14 = vminps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_22e8);
        local_400 = local_25c0._0_4_;
        fStack_3fc = local_25c0._4_4_;
        fStack_3f8 = local_25c0._8_4_;
        fStack_3f4 = local_25c0._12_4_;
        fStack_3f0 = local_25c0._16_4_;
        fStack_3ec = local_25c0._20_4_;
        fStack_3e8 = local_25c0._24_4_;
        fStack_3e4 = local_25c0._28_4_;
        local_420 = auVar14._0_4_;
        fStack_41c = auVar14._4_4_;
        fStack_418 = auVar14._8_4_;
        fStack_414 = auVar14._12_4_;
        fStack_410 = auVar14._16_4_;
        fStack_40c = auVar14._20_4_;
        fStack_408 = auVar14._24_4_;
        local_500 = auVar12._0_4_;
        fStack_4fc = auVar12._4_4_;
        fStack_4f8 = auVar12._8_4_;
        fStack_4f4 = auVar12._12_4_;
        fStack_4f0 = auVar12._16_4_;
        fStack_4ec = auVar12._20_4_;
        fStack_4e8 = auVar12._24_4_;
        fStack_4e4 = auVar12._28_4_;
        *(ulong *)*local_22e8 =
             CONCAT44(fStack_4fc + fStack_3fc * fStack_41c,local_500 + local_400 * local_420);
        *(ulong *)(*local_22e8 + 8) =
             CONCAT44(fStack_4f4 + fStack_3f4 * fStack_414,fStack_4f8 + fStack_3f8 * fStack_418);
        *(ulong *)(*local_22e8 + 0x10) =
             CONCAT44(fStack_4ec + fStack_3ec * fStack_40c,fStack_4f0 + fStack_3f0 * fStack_410);
        *(ulong *)(*local_22e8 + 0x18) =
             CONCAT44(fStack_4e4 + fStack_3e4,fStack_4e8 + fStack_3e8 * fStack_408);
        local_22e8 = (undefined1 (*) [64])(*local_22e8 + 0x20);
      }
      for (; local_22ec + 3 < iVar22; local_22ec = local_22ec + 4) {
        auVar11 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_22e8);
        auVar13 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_22e8);
        local_150 = (float)local_2590;
        fStack_14c = (float)((ulong)local_2590 >> 0x20);
        fStack_148 = (float)uStack_2588;
        fStack_144 = (float)((ulong)uStack_2588 >> 0x20);
        local_160 = auVar13._0_4_;
        fStack_15c = auVar13._4_4_;
        fStack_158 = auVar13._8_4_;
        fStack_154 = auVar13._12_4_;
        local_1d0 = auVar11._0_4_;
        fStack_1cc = auVar11._4_4_;
        fStack_1c8 = auVar11._8_4_;
        fStack_1c4 = auVar11._12_4_;
        *(ulong *)*local_22e8 =
             CONCAT44(fStack_1cc + fStack_14c * fStack_15c,local_1d0 + local_150 * local_160);
        *(ulong *)(*local_22e8 + 8) =
             CONCAT44(fStack_1c4 + fStack_144 * fStack_154,fStack_1c8 + fStack_148 * fStack_158);
        local_22e8 = (undefined1 (*) [64])(*local_22e8 + 0x10);
      }
      for (; local_22ec < iVar22; local_22ec = local_22ec + 1) {
        if (*(float *)*local_22e8 < 0.0) {
          *(float *)*local_22e8 = local_2580 * *(float *)*local_22e8;
        }
        local_22e8 = (undefined1 (*) [64])(*local_22e8 + 4);
      }
    }
  }
  if (iVar20 == 3) {
    iVar20 = iVar7 * (int)lVar18 * iVar8;
    for (local_23f8 = 0; local_23f8 < (int)lVar19; local_23f8 = local_23f8 + 1) {
      local_2400 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_23f8 * in_RSI[2]);
      local_2458 = 0;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
        local_262c = **(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      }
      else {
        local_262c = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                               (long)local_23f8 * 4);
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar8 != 4)) {
        local_2640 = CONCAT44(local_262c,local_262c);
        uStack_2638 = CONCAT44(local_262c,local_262c);
      }
      else {
        puVar21 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  (long)(local_23f8 << 2) * 4);
        local_2640 = *puVar21;
        uStack_2638 = puVar21[1];
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar8 != 8)) {
        local_2660._8_8_ = uStack_2638;
        local_2660._0_8_ = local_2640;
        local_2660._24_8_ = uStack_2638;
        local_2660._16_8_ = local_2640;
      }
      else {
        local_2660 = *(undefined1 (*) [32])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      (long)(local_23f8 << 3) * 4);
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar8 != 0x10)) {
        local_26c0 = vinsertf64x4_avx512f(ZEXT3264(local_2660),local_2660,1);
      }
      else {
        local_26c0 = *(undefined1 (*) [64])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      (long)(local_23f8 << 4) * 4);
      }
      for (; local_2458 + 0xf < iVar20; local_2458 = local_2458 + 0x10) {
        auVar24 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*local_2400);
        auVar25 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*local_2400);
        auVar25 = vmulps_avx512f(local_26c0,auVar25);
        auVar24 = vaddps_avx512f(auVar24,auVar25);
        local_1f80 = auVar24._0_8_;
        uStack_1f78 = auVar24._8_8_;
        uStack_1f70 = auVar24._16_8_;
        uStack_1f68 = auVar24._24_8_;
        uStack_1f60 = auVar24._32_8_;
        uStack_1f58 = auVar24._40_8_;
        uStack_1f50 = auVar24._48_8_;
        uStack_1f48 = auVar24._56_8_;
        *(undefined8 *)*local_2400 = local_1f80;
        *(undefined8 *)(*local_2400 + 8) = uStack_1f78;
        *(undefined8 *)(*local_2400 + 0x10) = uStack_1f70;
        *(undefined8 *)(*local_2400 + 0x18) = uStack_1f68;
        *(undefined8 *)(*local_2400 + 0x20) = uStack_1f60;
        *(undefined8 *)(*local_2400 + 0x28) = uStack_1f58;
        *(undefined8 *)(*local_2400 + 0x30) = uStack_1f50;
        *(undefined8 *)(*local_2400 + 0x38) = uStack_1f48;
        local_2400 = local_2400 + 1;
      }
      for (; local_2458 + 7 < iVar20; local_2458 = local_2458 + 8) {
        auVar12 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_2400);
        auVar14 = vminps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_2400);
        local_3c0 = local_2660._0_4_;
        fStack_3bc = local_2660._4_4_;
        fStack_3b8 = local_2660._8_4_;
        fStack_3b4 = local_2660._12_4_;
        fStack_3b0 = local_2660._16_4_;
        fStack_3ac = local_2660._20_4_;
        fStack_3a8 = local_2660._24_4_;
        fStack_3a4 = local_2660._28_4_;
        local_3e0 = auVar14._0_4_;
        fStack_3dc = auVar14._4_4_;
        fStack_3d8 = auVar14._8_4_;
        fStack_3d4 = auVar14._12_4_;
        fStack_3d0 = auVar14._16_4_;
        fStack_3cc = auVar14._20_4_;
        fStack_3c8 = auVar14._24_4_;
        local_4c0 = auVar12._0_4_;
        fStack_4bc = auVar12._4_4_;
        fStack_4b8 = auVar12._8_4_;
        fStack_4b4 = auVar12._12_4_;
        fStack_4b0 = auVar12._16_4_;
        fStack_4ac = auVar12._20_4_;
        fStack_4a8 = auVar12._24_4_;
        fStack_4a4 = auVar12._28_4_;
        *(ulong *)*local_2400 =
             CONCAT44(fStack_4bc + fStack_3bc * fStack_3dc,local_4c0 + local_3c0 * local_3e0);
        *(ulong *)(*local_2400 + 8) =
             CONCAT44(fStack_4b4 + fStack_3b4 * fStack_3d4,fStack_4b8 + fStack_3b8 * fStack_3d8);
        *(ulong *)(*local_2400 + 0x10) =
             CONCAT44(fStack_4ac + fStack_3ac * fStack_3cc,fStack_4b0 + fStack_3b0 * fStack_3d0);
        *(ulong *)(*local_2400 + 0x18) =
             CONCAT44(fStack_4a4 + fStack_3a4,fStack_4a8 + fStack_3a8 * fStack_3c8);
        local_2400 = (undefined1 (*) [64])(*local_2400 + 0x20);
      }
      for (; local_2458 + 3 < iVar20; local_2458 = local_2458 + 4) {
        auVar11 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_2400);
        auVar13 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_2400);
        local_130 = (float)local_2640;
        fStack_12c = (float)((ulong)local_2640 >> 0x20);
        fStack_128 = (float)uStack_2638;
        fStack_124 = (float)((ulong)uStack_2638 >> 0x20);
        local_140 = auVar13._0_4_;
        fStack_13c = auVar13._4_4_;
        fStack_138 = auVar13._8_4_;
        fStack_134 = auVar13._12_4_;
        local_1b0 = auVar11._0_4_;
        fStack_1ac = auVar11._4_4_;
        fStack_1a8 = auVar11._8_4_;
        fStack_1a4 = auVar11._12_4_;
        *(ulong *)*local_2400 =
             CONCAT44(fStack_1ac + fStack_12c * fStack_13c,local_1b0 + local_130 * local_140);
        *(ulong *)(*local_2400 + 8) =
             CONCAT44(fStack_1a4 + fStack_124 * fStack_134,fStack_1a8 + fStack_128 * fStack_138);
        local_2400 = (undefined1 (*) [64])(*local_2400 + 0x10);
      }
      for (; local_2458 < iVar20; local_2458 = local_2458 + 1) {
        if (*(float *)*local_2400 < 0.0) {
          *(float *)*local_2400 = local_262c * *(float *)*local_2400;
        }
        local_2400 = (undefined1 (*) [64])(*local_2400 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}